

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hand.cpp
# Opt level: O1

void __thiscall Hand::getHigherFinger(Hand *this)

{
  int iVar1;
  pointer pFVar2;
  Finger *f;
  pointer pFVar3;
  int iVar4;
  Finger hf;
  Finger local_48;
  
  Finger::Finger(&local_48);
  pFVar3 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar2 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pFVar3 != pFVar2) {
    iVar4 = -1;
    do {
      iVar1 = (pFVar3->ptStart).y;
      if (iVar1 < iVar4 || iVar4 == -1) {
        local_48.ptStart.x = (pFVar3->ptStart).x;
        local_48.ptEnd.x = (pFVar3->ptEnd).x;
        local_48.ptEnd.y = (pFVar3->ptEnd).y;
        local_48.ptFar.x = (pFVar3->ptFar).x;
        local_48.ptFar.y = (pFVar3->ptFar).y;
        local_48.index = pFVar3->index;
        local_48.hndAngle = pFVar3->hndAngle;
        local_48.depth = pFVar3->depth;
        local_48.maxAngle = pFVar3->maxAngle;
        local_48.minDepth = pFVar3->minDepth;
        local_48.ok = pFVar3->ok;
        local_48.shouldCheckAngles = pFVar3->shouldCheckAngles;
        local_48.shouldCheckDist = pFVar3->shouldCheckDist;
        local_48._39_1_ = pFVar3->field_0x27;
        local_48.boundingBox.x = (pFVar3->boundingBox).x;
        local_48.boundingBox.y = (pFVar3->boundingBox).y;
        local_48.boundingBox.width = (pFVar3->boundingBox).width;
        local_48.boundingBox.height = (pFVar3->boundingBox).height;
        iVar4 = iVar1;
        local_48.ptStart.y = iVar1;
      }
      pFVar3 = pFVar3 + 1;
    } while (pFVar3 != pFVar2);
  }
  (this->higherFinger).ptStart.x = local_48.ptStart.x;
  (this->higherFinger).ptStart.y = local_48.ptStart.y;
  (this->higherFinger).ptEnd.x = local_48.ptEnd.x;
  (this->higherFinger).ptEnd.y = local_48.ptEnd.y;
  (this->higherFinger).ptFar.x = local_48.ptFar.x;
  (this->higherFinger).ptFar.y = local_48.ptFar.y;
  (this->higherFinger).depth = local_48.depth;
  (this->higherFinger).maxAngle = local_48.maxAngle;
  (this->higherFinger).minDepth = local_48.minDepth;
  (this->higherFinger).ok = local_48.ok;
  (this->higherFinger).shouldCheckAngles = local_48.shouldCheckAngles;
  (this->higherFinger).shouldCheckDist = local_48.shouldCheckDist;
  (this->higherFinger).field_0x27 = local_48._39_1_;
  (this->higherFinger).index = local_48.index;
  (this->higherFinger).hndAngle = local_48.hndAngle;
  (this->higherFinger).boundingBox.x = local_48.boundingBox.x;
  (this->higherFinger).boundingBox.y = local_48.boundingBox.y;
  (this->higherFinger).boundingBox.width = local_48.boundingBox.width;
  (this->higherFinger).boundingBox.height = local_48.boundingBox.height;
  return;
}

Assistant:

void Hand::getHigherFinger() {
    int maxY = -1;
    Finger hf;
    for (Finger &f : fingers) {
        if (maxY == -1 || f.ptStart.y < maxY) {
            maxY = f.ptStart.y;
            hf = f;
        }
    }
    higherFinger = hf;
}